

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

ON_PolynomialCurve * __thiscall
ON_PolynomialCurve::operator=(ON_PolynomialCurve *this,ON_BezierCurve *src)

{
  ON_4dPoint *pOVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  double *pdVar9;
  uint uVar10;
  ulong uVar11;
  ON_4dPoint *pOVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  ON_BezierCurve s;
  
  iVar6 = src->m_is_rat;
  this->m_dim = src->m_dim;
  this->m_is_rat = iVar6;
  uVar10 = src->m_order;
  this->m_order = uVar10;
  uVar8 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_capacity;
  if (uVar8 < uVar10) {
    ON_SimpleArray<ON_4dPoint>::SetCapacity
              (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,(long)(int)uVar10);
    uVar8 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_capacity;
    uVar10 = src->m_order;
  }
  if ((int)uVar10 <= (int)uVar8 && -1 < (int)uVar10) {
    (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_count = uVar10;
  }
  pOVar12 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a;
  if (0 < (int)uVar8 && pOVar12 != (ON_4dPoint *)0x0) {
    memset(pOVar12,0,(ulong)uVar8 << 5);
  }
  if ((1 < this->m_order) && ((int)((uint)(src->m_is_rat != 0 && 0 < src->m_dim) + src->m_dim) < 5))
  {
    ON_BezierCurve::ON_BezierCurve(&s);
    s.m_dim = (src->m_dim + 1) - (uint)(src->m_is_rat == 0);
    s.m_is_rat = 0;
    s.m_order = src->m_order;
    s.m_cv = src->m_cv;
    bVar7 = ON_EvaluateBezier(s.m_dim,false,s.m_order,s.m_cv_stride,s.m_cv,0.0,1.0,
                              this->m_order + -1,0.0,4,
                              &((this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a)->x);
    if (bVar7) {
      if (this->m_is_rat == 0) {
        ((this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a)->w = 1.0;
        uVar10 = this->m_order;
      }
      else {
        uVar10 = this->m_order;
        if (0 < (int)uVar10 && this->m_dim < 3) {
          lVar14 = 0;
          lVar13 = 0;
          do {
            pOVar1 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a;
            pOVar12 = (ON_4dPoint *)((long)&pOVar1->x + lVar14);
            pdVar9 = ON_4dPoint::operator[](pOVar12,this->m_dim);
            *(double *)((long)&pOVar1->w + lVar14) = *pdVar9;
            pdVar9 = ON_4dPoint::operator[](pOVar12,this->m_dim);
            *pdVar9 = 0.0;
            lVar13 = lVar13 + 1;
            uVar10 = this->m_order;
            lVar14 = lVar14 + 0x20;
          } while (lVar13 < (int)uVar10);
        }
      }
      if (2 < (int)uVar10) {
        pdVar9 = &(this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a[2].z;
        uVar11 = 2;
        do {
          dVar15 = 1.0 / (double)(int)uVar11;
          dVar4 = *pdVar9;
          dVar5 = pdVar9[1];
          dVar3 = ((ON_4dPoint *)(pdVar9 + -2))->x * dVar15;
          auVar2._8_4_ = SUB84(pdVar9[-1] * dVar15,0);
          auVar2._0_8_ = dVar3;
          auVar2._12_4_ = (int)((ulong)(pdVar9[-1] * dVar15) >> 0x20);
          ((ON_4dPoint *)(pdVar9 + -2))->x = dVar3;
          ((ON_4dPoint *)(pdVar9 + -2))->y = (double)auVar2._8_8_;
          *pdVar9 = dVar4 * dVar15;
          pdVar9[1] = dVar5 * dVar15;
          uVar11 = uVar11 + 1;
          pdVar9 = pdVar9 + 4;
        } while (uVar10 != uVar11);
      }
    }
    else {
      pOVar12 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a;
      lVar13 = (long)(this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_capacity;
      if (0 < lVar13) {
        memset(pOVar12,0,lVar13 << 5);
        pOVar12 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a;
      }
      pOVar12->w = 1.0;
    }
    s.m_cv = (double *)0x0;
    ON_BezierCurve::~ON_BezierCurve(&s);
  }
  return this;
}

Assistant:

ON_PolynomialCurve& ON_PolynomialCurve::operator=(const ON_BezierCurve& src)
{
  int i;
  double d;
  m_dim = src.m_dim;
  m_is_rat = src.m_is_rat;
  m_order = src.m_order;
  m_cv.Reserve( src.m_order );
  m_cv.SetCount( src.m_order );
  m_cv.Zero();
  //m_domain = src.m_domain;

  if ( m_order >= 2 && src.CVSize() <= 4 ) {
    ON_BezierCurve s; // scratch surface for homogeneous evaluation
    s.m_dim = src.m_is_rat ? src.m_dim+1 : src.m_dim;
    s.m_is_rat = 0;
    s.m_order = src.m_order;
    s.m_cv = src.m_cv;
    //s.m_domain.m_t[0] = 0.0;
    //s.m_domain.m_t[1] = 1.0;
    if ( s.Evaluate( 0.0, m_order-1, 4, &m_cv[0].x ) ) {
      if ( m_is_rat ) {
        if ( m_dim < 3 ) {
          for ( i = 0; i < m_order; i++ ) {
            ON_4dPoint& cv = m_cv[i];
            cv.w = cv[m_dim];
            cv[m_dim] = 0.0;
          }
        }
      }
      else {
        m_cv[0].w = 1.0;
      }
      for ( i = 2; i < m_order; i++ ) {
        d = 1.0/i;
        ON_4dPoint& cv = m_cv[i];
        cv.x *= d;
        cv.y *= d;
        cv.z *= d;
        cv.w *= d;
      }
    }
    else {
      m_cv.Zero();
      m_cv[0].w = 1.0;
    }
    s.m_cv = 0;
  }

  return *this;
}